

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini_processing.cpp
# Opt level: O0

void readNumArrHelper<std::vector<long,std::allocator<long>>,long>
               (IniProcessing *self,char *key,vector<long,_std::allocator<long>_> *dest,
               vector<long,_std::allocator<long>_> *defVal)

{
  pointer ppVar1;
  value_type_conflict5 local_40;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_38;
  iterator e;
  bool ok;
  vector<long,_std::allocator<long>_> *defVal_local;
  vector<long,_std::allocator<long>_> *dest_local;
  char *key_local;
  IniProcessing *self_local;
  
  e.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  ._M_cur._7_1_ = 0;
  local_38._M_cur =
       (__node_type *)
       IniProcessing_readHelper_abi_cxx11_
                 (self,key,(bool *)((long)&e.
                                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                           ._M_cur + 7));
  if ((e.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
       ._M_cur._7_1_ & 1) == 0) {
    std::vector<long,_std::allocator<long>_>::operator=(dest,defVal);
  }
  else {
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                           *)&local_38);
    local_40 = 0;
    StrToNumVectorHelper<std::vector<long,std::allocator<long>>>(&ppVar1->second,dest,&local_40);
  }
  return;
}

Assistant:

void readNumArrHelper(IniProcessing *self, const char *key, TList &dest, const TList &defVal)
{
    bool ok = false;
    IniProcessing::params::IniKeys::iterator e = IniProcessing_readHelper(self, key, ok);

    if(!ok)
    {
        dest = defVal;
        return;
    }

    StrToNumVectorHelper(e->second, dest, static_cast<T>(0));
}